

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O0

size_t writeFunction(void *ptr,size_t size,size_t nmemb,Data *data)

{
  mapped_type *this;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  key_type *in_stack_00000008;
  size_t bytesDownloaded;
  
  g_totalBytesDownloaded = in_RSI * in_RDX + g_totalBytesDownloaded;
  std::__cxx11::string::append((char *)(in_RCX + 0x30),in_RDI);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)bytesDownloaded,in_stack_00000008);
  std::__cxx11::string::operator=((string *)this,(string *)(in_RCX + 0x30));
  std::__cxx11::string::clear();
  return in_RSI * in_RDX;
}

Assistant:

static size_t writeFunction(void *ptr, size_t size, size_t nmemb, Data* data) {
    size_t bytesDownloaded = size*nmemb;
    g_totalBytesDownloaded += bytesDownloaded;

    data->content.append((char*) ptr, bytesDownloaded);

#ifdef ENABLE_API_CACHE
    auto fname = ::getCacheFname(data->uri);

    std::ofstream fout(fname);
    fout.write(data->content.c_str(), data->content.size());
    fout.close();
#endif

    g_fetchCache[data->uri] = std::move(data->content);
    data->content.clear();

    return bytesDownloaded;
}